

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcompositorbackingstore.cpp
# Opt level: O0

void __thiscall
QOpenGLCompositorBackingStore::resize
          (QOpenGLCompositorBackingStore *this,QSize *size,QRegion *staticContents)

{
  QOpenGLCompositor *this_00;
  QOpenGLContext *pQVar1;
  QWindow *pQVar2;
  QSize *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QWindow *dstWin;
  QOpenGLContext *dstCtx;
  QOpenGLCompositor *compositor;
  QImage *in_stack_ffffffffffffff90;
  QImage *in_stack_ffffffffffffff98;
  QImage local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QOpenGLCompositor::instance();
  pQVar1 = QOpenGLCompositor::context(this_00);
  if ((pQVar1 != (QOpenGLContext *)0x0) &&
     (pQVar2 = QOpenGLCompositor::targetWindow(this_00), pQVar2 != (QWindow *)0x0)) {
    QImage::QImage(local_20,in_RSI,Format_RGBA8888);
    QImage::operator=(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    QImage::~QImage(local_20);
    QWindow::create();
    QOpenGLContext::makeCurrent((QSurface *)pQVar1);
    if (*(int *)(in_RDI + 0x38) != 0) {
      if (*(long **)(in_RDI + 0x40) != (long *)0x0) {
        (**(code **)(**(long **)(in_RDI + 0x40) + 8))();
      }
      *(undefined8 *)(in_RDI + 0x40) = 0;
      glDeleteTextures(1,in_RDI + 0x38);
      *(undefined4 *)(in_RDI + 0x38) = 0;
      *(undefined8 *)(in_RDI + 0x48) = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLCompositorBackingStore::resize(const QSize &size, const QRegion &staticContents)
{
    Q_UNUSED(staticContents);

    QOpenGLCompositor *compositor = QOpenGLCompositor::instance();
    QOpenGLContext *dstCtx = compositor->context();
    if (!dstCtx)
        return;
    QWindow *dstWin = compositor->targetWindow();
    if (!dstWin)
        return;

    m_image = QImage(size, QImage::Format_RGBA8888);

    m_window->create();

    dstCtx->makeCurrent(dstWin);
    if (m_bsTexture) {
        delete m_bsTextureWrapper;
        m_bsTextureWrapper = nullptr;
        glDeleteTextures(1, &m_bsTexture);
        m_bsTexture = 0;
        m_bsTextureContext = nullptr;
    }
}